

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

int __thiscall Js::InterpreterStackFrame::ProcessFinally(InterpreterStackFrame *this)

{
  long lVar1;
  int iVar2;
  void *pointer;
  
  *(short *)(this + 0xe4) = *(short *)(this + 0xe4) + 1;
  lVar1 = *(long *)(*(long *)(this + 0x88) + 0x20);
  if (((*(long *)(lVar1 + 0x80) == 0) && ((*(byte *)(lVar1 + 0xa8) & 0x20) == 0)) ||
     ((*(byte *)(lVar1 + 0xa8) & 0x40) == 0)) {
    pointer = Process(this);
  }
  else {
    pointer = DebugProcess(this);
  }
  iVar2 = ::Math::PointerCastToIntegral<int>(pointer);
  return iVar2;
}

Assistant:

int InterpreterStackFrame::ProcessFinally()
    {
        this->nestedFinallyDepth++;

        int newOffset = 0;
#ifdef ENABLE_SCRIPT_DEBUGGING
        if (this->IsInDebugMode())
        {
            newOffset = ::Math::PointerCastToIntegral<int>(this->DebugProcess());
        }
        else
#endif
        {
            newOffset = ::Math::PointerCastToIntegral<int>(this->Process());
        }

        return newOffset;
    }